

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int VP8LDecodeHeader(VP8LDecoder *dec,VP8Io *io)

{
  int iVar1;
  int height;
  int width;
  int has_alpha;
  int local_2c;
  int local_28;
  int local_24;
  
  if (dec != (VP8LDecoder *)0x0) {
    if (io == (VP8Io *)0x0) {
      if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
        dec->status = VP8_STATUS_INVALID_PARAM;
      }
    }
    else {
      dec->io = io;
      dec->status = VP8_STATUS_OK;
      VP8LInitBitReader(&dec->br,io->data,io->data_size);
      iVar1 = ReadImageInfo(&dec->br,&local_28,&local_2c,&local_24);
      if (iVar1 == 0) {
        if ((dec->status == VP8_STATUS_SUSPENDED) || (dec->status == VP8_STATUS_OK)) {
          dec->status = VP8_STATUS_BITSTREAM_ERROR;
        }
      }
      else {
        dec->state = READ_DIM;
        io->width = local_28;
        io->height = local_2c;
        iVar1 = DecodeImageStream(local_28,local_2c,1,dec,(uint32_t **)0x0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      VP8LClear(dec);
    }
  }
  return 0;
}

Assistant:

int VP8LDecodeHeader(VP8LDecoder* const dec, VP8Io* const io) {
  int width, height, has_alpha;

  if (dec == NULL) return 0;
  if (io == NULL) {
    return VP8LSetError(dec, VP8_STATUS_INVALID_PARAM);
  }

  dec->io = io;
  dec->status = VP8_STATUS_OK;
  VP8LInitBitReader(&dec->br, io->data, io->data_size);
  if (!ReadImageInfo(&dec->br, &width, &height, &has_alpha)) {
    VP8LSetError(dec, VP8_STATUS_BITSTREAM_ERROR);
    goto Error;
  }
  dec->state = READ_DIM;
  io->width = width;
  io->height = height;

  if (!DecodeImageStream(width, height, /*is_level0=*/1, dec,
                         /*decoded_data=*/NULL)) {
    goto Error;
  }
  return 1;

 Error:
  VP8LClear(dec);
  assert(dec->status != VP8_STATUS_OK);
  return 0;
}